

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

int __thiscall
FIX::DataDictionary::lookupXMLFieldNumber(DataDictionary *this,DOMDocument *pDoc,string *name)

{
  const_iterator cVar1;
  ConfigError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_names)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_names)._M_t._M_impl.super__Rb_tree_header) {
    return cVar1._M_node[2]._M_color;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&bStack_58,"Field ",name);
  std::operator+(&local_38,&bStack_58," not defined in fields section");
  ConfigError::ConfigError(this_00,&local_38);
  __cxa_throw(this_00,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

int DataDictionary::lookupXMLFieldNumber(DOMDocument *pDoc, const std::string &name) const {
  NameToField::const_iterator i = m_names.find(name);
  if (i == m_names.end()) {
    throw ConfigError("Field " + name + " not defined in fields section");
  }
  return i->second;
}